

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcastu.c
# Opt level: O3

int castmu(monst *mtmp,attack *mattk,boolean thinks_it_foundyou,boolean foundyou)

{
  byte bVar1;
  boolean bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  obj *poVar8;
  undefined *puVar9;
  byte bVar10;
  char *pcVar11;
  int iVar12;
  int tmp;
  uint uVar13;
  uint uVar14;
  byte bVar15;
  uint local_38;
  
  bVar1 = mtmp->m_lev;
  bVar15 = mattk->adtyp;
  if (bVar15 == 0xf1) {
    if (bVar1 == 0) {
      uVar3 = 0;
      bVar15 = 0xf1;
    }
    else {
LAB_001c1bb8:
      uVar14 = 0x29;
      do {
        uVar3 = mt_random();
        local_38 = (uint)bVar1;
        bVar15 = mattk->adtyp;
        bVar10 = (char)(uVar3 % local_38) - 1;
        if (bVar15 == 0xf1) {
          if (bVar10 < 0x16) {
            puVar9 = &DAT_002b2ddc;
            goto LAB_001c1bf8;
          }
LAB_001c1c01:
          uVar3 = 0;
        }
        else {
          if (0xc < bVar10) goto LAB_001c1c01;
          puVar9 = &DAT_002b2e34;
LAB_001c1bf8:
          uVar3 = *(uint *)(puVar9 + (ulong)bVar10 * 4);
        }
        if (thinks_it_foundyou == '\0') {
          if (bVar15 == 0xf0) {
            if ((uVar3 - 1 & 0xfffffffb) != 0) goto LAB_001c1dcf;
          }
          else if (((bVar15 != 0xf1) || (10 < uVar3)) || ((0x716U >> (uVar3 & 0x1f) & 1) == 0))
          goto LAB_001c1dcf;
          bVar2 = spell_would_be_useless(mtmp,(uint)bVar15,uVar3);
          if (bVar2 != '\0') {
LAB_001c1dcf:
            if (foundyou == '\0') {
              return 0;
            }
            warning("spellcasting monster found you and doesn\'t know it?");
            return 0;
          }
          break;
        }
        uVar14 = uVar14 - 1;
        if (uVar14 < 2) {
          return 0;
        }
        bVar2 = spell_would_be_useless(mtmp,(uint)bVar15,uVar3);
      } while (bVar2 != '\0');
    }
  }
  else {
    uVar3 = 0;
    if (bVar15 == 0xf0 && bVar1 != 0) goto LAB_001c1bb8;
  }
  uVar14 = *(uint *)&mtmp->field_0x60;
  if (((uVar14 >> 8 & 1) != 0) || (mtmp->mspec_used != 0 || bVar1 == 0)) {
    if (bVar15 == 0xf0) {
      bVar2 = (uVar3 - 1 & 0xfffffffb) == 0;
    }
    else if ((bVar15 == 0xf1) && (uVar3 - 1 < 10)) {
      bVar2 = (&DAT_002b2e68)[uVar3 - 1];
    }
    else {
      bVar2 = '\0';
    }
    cursetxt(mtmp,bVar2);
    return 0;
  }
  if ((bVar15 & 0xfe) == 0xf0) {
    iVar5 = 2;
    if (mtmp->m_lev < 9) {
      iVar5 = 10 - (uint)mtmp->m_lev;
    }
    iVar12 = 0;
    if (mtmp->data->msound != '\x1f') {
      iVar12 = iVar5;
    }
    mtmp->mspec_used = iVar12;
  }
  if (thinks_it_foundyou != '\0' && foundyou == '\0') {
    if (mattk->adtyp == 0xf0) {
      if ((uVar3 - 1 & 0xfffffffb) != 0) goto LAB_001c1e23;
    }
    else if (((mattk->adtyp != 0xf1) || (10 < uVar3)) || ((0x716U >> (uVar3 & 0x1f) & 1) == 0)) {
LAB_001c1e23:
      if (mtmp->wormno == '\0') {
        if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_001c283f;
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001c1f50;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001c1f47;
        }
        else {
LAB_001c1f47:
          if (ublindf == (obj *)0x0) goto LAB_001c289e;
LAB_001c1f50:
          if (ublindf->oartifact != '\x1d') goto LAB_001c289e;
        }
        if ((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
           (((youmonst.data)->mflags3 & 0x100) != 0)) {
          pcVar7 = "Something";
          if (((viz_array[mtmp->my][mtmp->mx] & 1U) == 0) || ((mtmp->data->mflags3 & 0x200) == 0))
          goto LAB_001c28a5;
          goto LAB_001c283f;
        }
      }
      else {
        bVar2 = worm_known(level,mtmp);
        if (bVar2 != '\0') {
          uVar14 = *(uint *)&mtmp->field_0x60;
LAB_001c283f:
          if ((((uVar14 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
             (u.uprops[0xc].extrinsic != 0)) {
            if ((uVar14 & 0x280) != 0) goto LAB_001c289e;
          }
          else {
            pcVar7 = "Something";
            if (((uVar14 & 0x280) != 0) || (((youmonst.data)->mflags1 & 0x1000000) == 0))
            goto LAB_001c28a5;
          }
          if ((u._1052_1_ & 0x20) == 0) {
            pcVar7 = Monnam(mtmp);
            goto LAB_001c28a5;
          }
        }
      }
LAB_001c289e:
      pcVar7 = "Something";
LAB_001c28a5:
      pcVar11 = "thin air";
      if (level->locations[mtmp->mux][mtmp->muy].typ == '\x13') {
        pcVar11 = "empty water";
      }
      pline("%s casts a spell at %s!",pcVar7,pcVar11);
      return 0;
    }
  }
  nomul(0,(char *)0x0);
  uVar6 = (uint)bVar1;
  uVar4 = mt_random();
  uVar14 = *(uint *)&mtmp->field_0x60;
  uVar13 = 100;
  if ((uVar14 >> 0x15 & 1) == 0) {
    uVar13 = 0x14;
  }
  if (uVar4 % (uVar6 * 10) < uVar13) {
    if (mtmp->wormno != '\0') {
      bVar2 = worm_known(level,mtmp);
      if (bVar2 == '\0') {
        return 0;
      }
      uVar14 = *(uint *)&mtmp->field_0x60;
      goto LAB_001c1fc7;
    }
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_001c1fc7;
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001c1e9c;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001c1e93;
    }
    else {
LAB_001c1e93:
      if (ublindf == (obj *)0x0) {
        return 0;
      }
LAB_001c1e9c:
      if (ublindf->oartifact != '\x1d') {
        return 0;
      }
    }
    if ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
       (((youmonst.data)->mflags3 & 0x100) == 0)) {
      return 0;
    }
    if ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0) {
      return 0;
    }
    if ((mtmp->data->mflags3 & 0x200) == 0) {
      return 0;
    }
LAB_001c1fc7:
    if ((((uVar14 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) {
      if ((uVar14 & 0x280) != 0) {
        return 0;
      }
    }
    else {
      if ((uVar14 & 0x280) != 0) {
        return 0;
      }
      if (((youmonst.data)->mflags1 & 0x1000000) == 0) {
        return 0;
      }
    }
    if ((u._1052_1_ & 0x20) != 0) {
      return 0;
    }
    if (flags.soundok == '\0') {
      return 0;
    }
    pcVar7 = mon_nam(mtmp);
    pline("The air crackles around %s.",pcVar7);
    return 0;
  }
  if (mtmp->wormno == '\0') {
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001c1ef6;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001c1eed;
      }
      else {
LAB_001c1eed:
        if (ublindf == (obj *)0x0) goto LAB_001c20ff;
LAB_001c1ef6:
        if (ublindf->oartifact != '\x1d') goto LAB_001c20ff;
      }
      if (((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
          (((youmonst.data)->mflags3 & 0x100) == 0)) ||
         (((viz_array[mtmp->my][mtmp->mx] & 1U) == 0 || ((mtmp->data->mflags3 & 0x200) == 0))))
      goto LAB_001c20ff;
    }
LAB_001c20b0:
    if ((((uVar14 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) && (u.uprops[0xc].extrinsic == 0)) {
      if (((uVar14 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
      goto LAB_001c20f2;
      goto LAB_001c20ff;
    }
    if ((uVar14 & 0x280) != 0) goto LAB_001c20ff;
LAB_001c20f2:
    if ((u._1052_1_ & 0x20) != 0) goto LAB_001c20ff;
LAB_001c2264:
    if (mtmp->wormno == '\0') {
      if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001c22cc;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001c22c3;
        }
        else {
LAB_001c22c3:
          if (ublindf == (obj *)0x0) goto LAB_001c237d;
LAB_001c22cc:
          if (ublindf->oartifact != '\x1d') goto LAB_001c237d;
        }
        if (((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
            (((youmonst.data)->mflags3 & 0x100) == 0)) ||
           (((viz_array[mtmp->my][mtmp->mx] & 1U) == 0 || ((mtmp->data->mflags3 & 0x200) == 0))))
        goto LAB_001c237d;
      }
LAB_001c2327:
      uVar14 = *(uint *)&mtmp->field_0x60;
      if ((((uVar14 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) && (u.uprops[0xc].extrinsic == 0))
      {
        if (((uVar14 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
        goto LAB_001c2370;
        goto LAB_001c237d;
      }
      if ((uVar14 & 0x280) != 0) goto LAB_001c237d;
LAB_001c2370:
      if ((u._1052_1_ & 0x20) != 0) goto LAB_001c237d;
LAB_001c24e2:
      pcVar7 = Monnam(mtmp);
    }
    else {
      bVar2 = worm_known(level,mtmp);
      if (bVar2 != '\0') goto LAB_001c2327;
LAB_001c237d:
      if (((mtmp->data->mflags1 & 0x10000) == 0) &&
         ((poVar8 = which_armor(mtmp,4), poVar8 == (obj *)0x0 ||
          (poVar8 = which_armor(mtmp,4), poVar8->otyp != 0x4f)))) {
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001c23d6;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001c23d1;
        }
        else {
LAB_001c23d1:
          if (ublindf != (obj *)0x0) {
LAB_001c23d6:
            if (ublindf->oartifact == '\x1d') goto LAB_001c2470;
          }
          if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
               (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
               youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) goto LAB_001c24e2;
        }
LAB_001c2470:
        if ((u.uprops[0x19].extrinsic != 0) &&
           ((u.uprops[0x19].blocked == 0 &&
            (iVar5 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar5 < 0x41))))
        goto LAB_001c24e2;
      }
      if ((u.uprops[0x42].intrinsic != 0) ||
         ((u.uprops[0x42].extrinsic != 0 || (bVar2 = match_warn_of_mon(mtmp), bVar2 != '\0'))))
      goto LAB_001c24e2;
      pcVar7 = "Something";
    }
    if (mattk->adtyp == 0xf0) {
      if ((uVar3 - 1 & 0xfffffffb) != 0) goto LAB_001c252a;
LAB_001c2513:
      pcVar11 = "";
    }
    else {
      if (((mattk->adtyp == 0xf1) && (uVar3 - 1 < 10)) && ((0x38bU >> (uVar3 - 1 & 0x1f) & 1) != 0))
      goto LAB_001c2513;
LAB_001c252a:
      if ((((((youmonst.data != mons + 0x7b && youmonst.data != mons + 0x9e) &&
              (u.uprops[0xd].extrinsic == 0 && u.uprops[0xd].intrinsic == 0)) ||
            (u.uprops[0xd].blocked != 0)) ||
           ((u.uprops[0xc].intrinsic != 0 ||
            ((u.uprops[0xc].extrinsic != 0 || (((youmonst.data)->mflags1 & 0x1000000) != 0)))))) ||
          ((mtmp->data->mflags1 & 0x1000000) != 0)) ||
         ((pcVar11 = " at a spot near you", mtmp->mux == u.ux && (mtmp->muy == u.uy)))) {
        if (u.uprops[0x2d].extrinsic == 0) {
          pcVar11 = " at you";
        }
        else if (mtmp->mux == u.ux) {
          pcVar11 = " at your displaced image";
          if (mtmp->muy == u.uy) {
            pcVar11 = " at you";
          }
        }
        else {
          pcVar11 = " at your displaced image";
        }
      }
    }
    pline("%s casts a spell%s!",pcVar7,pcVar11);
  }
  else {
    bVar2 = worm_known(level,mtmp);
    if (bVar2 != '\0') {
      uVar14 = *(uint *)&mtmp->field_0x60;
      goto LAB_001c20b0;
    }
LAB_001c20ff:
    if (((mtmp->data->mflags1 & 0x10000) == 0) &&
       ((poVar8 = which_armor(mtmp,4), poVar8 == (obj *)0x0 ||
        (poVar8 = which_armor(mtmp,4), poVar8->otyp != 0x4f)))) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001c2158;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001c2153;
      }
      else {
LAB_001c2153:
        if (ublindf != (obj *)0x0) {
LAB_001c2158:
          if (ublindf->oartifact == '\x1d') goto LAB_001c21f2;
        }
        if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
             (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
             youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) goto LAB_001c2264;
      }
LAB_001c21f2:
      if ((u.uprops[0x19].extrinsic != 0) &&
         ((u.uprops[0x19].blocked == 0 &&
          (iVar5 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar5 < 0x41))))
      goto LAB_001c2264;
    }
    if ((u.uprops[0x42].intrinsic != 0) ||
       ((u.uprops[0x42].extrinsic != 0 || (bVar2 = match_warn_of_mon(mtmp), bVar2 != '\0'))))
    goto LAB_001c2264;
    if (mattk->adtyp == 0xf0) {
      if ((uVar3 - 1 & 0xfffffffb) != 0) goto LAB_001c2264;
    }
    else if (((mattk->adtyp != 0xf1) || (10 < uVar3)) || ((0x716U >> (uVar3 & 0x1f) & 1) == 0))
    goto LAB_001c2264;
  }
  if (foundyou == '\0') {
    if ((mattk->adtyp & 0xfe) != 0xf0) {
      pcVar7 = Monnam(mtmp);
      warning("%s casting non-hand-to-hand version of hand-to-hand spell %d?",pcVar7,
              (ulong)mattk->adtyp);
      return 0;
    }
  }
  else {
    uVar14 = 0x1e;
    if (uVar6 < 0x1e) {
      uVar14 = uVar6;
    }
    bVar1 = mattk->damd;
    if (bVar1 == 0) {
      uVar14 = (uint)(byte)((char)(uVar14 * 0x34 >> 8) + 1);
      uVar13 = uVar14;
      do {
        uVar6 = mt_random();
        uVar14 = uVar14 + uVar6 % 6;
        uVar13 = uVar13 - 1;
      } while (uVar13 != 0);
      goto LAB_001c2689;
    }
    uVar13 = (uint)mattk->damn + (uVar14 * 0x34 >> 8);
    uVar14 = uVar13;
    if (uVar13 != 0) {
      do {
        uVar6 = mt_random();
        uVar14 = uVar14 + uVar6 % (uint)bVar1;
        uVar13 = uVar13 - 1;
      } while (uVar13 != 0);
      goto LAB_001c2689;
    }
  }
  uVar14 = 0;
LAB_001c2689:
  if (u.uprops[0x32].extrinsic != 0 || u.uprops[0x32].intrinsic != 0) {
    uVar14 = (int)((uVar14 - ((int)(uVar14 + 1) >> 0x1f)) + 1) >> 1;
  }
  bVar1 = mattk->adtyp;
  if (bVar1 < 3) {
    if (bVar1 == 1) {
      pline("You are hit by a shower of missiles!");
      mana_damageu(uVar14,mtmp,(char *)0x0,0,'\x01');
      return 1;
    }
    if (bVar1 == 2) {
      pline("You\'re enveloped in flames!");
      fire_damageu(uVar14,mtmp,(char *)0x0,0,0,'\x01','\x01');
      return 1;
    }
  }
  else {
    if (bVar1 == 3) {
      pline("You\'re covered in frost!");
      cold_damageu(uVar14,mtmp,(char *)0x0,0,0);
      return 1;
    }
    if (bVar1 == 0xf0) {
      cast_cleric_spell(mtmp,uVar14,uVar3);
      return 1;
    }
    if (bVar1 == 0xf1) {
      cast_wizard_spell(mtmp,uVar14,uVar3);
      return 1;
    }
  }
  if (uVar14 != 0) {
    mdamageu(mtmp,uVar14);
  }
  return 1;
}

Assistant:

int castmu(struct monst *mtmp,
	   const struct attack *mattk,
	   boolean thinks_it_foundyou,
	   boolean foundyou)
{
	int	dmg, ml = mtmp->m_lev;
	int ret;
	int spellnum = 0;

	/* Three cases:
	 * -- monster is attacking you.  Search for a useful spell.
	 * -- monster thinks it's attacking you.  Search for a useful spell,
	 *    without checking for undirected.  If the spell found is directed,
	 *    it fails with cursetxt() and loss of mspec_used.
	 * -- monster isn't trying to attack.  Select a spell once.  Don't keep
	 *    searching; if that spell is not useful (or if it's directed),
	 *    return and do something else. 
	 * Since most spells are directed, this means that a monster that isn't
	 * attacking casts spells only a small portion of the time that an
	 * attacking monster does.
	 */
	if ((mattk->adtyp == AD_SPEL || mattk->adtyp == AD_CLRC) && ml) {
	    int cnt = 40;

	    do {
		spellnum = rn2(ml);
		if (mattk->adtyp == AD_SPEL)
		    spellnum = choose_magic_spell(spellnum);
		else
		    spellnum = choose_clerical_spell(spellnum);
		/* not trying to attack?  don't allow directed spells */
		if (!thinks_it_foundyou) {
		    if (!is_undirected_spell(mattk->adtyp, spellnum) ||
			spell_would_be_useless(mtmp, mattk->adtyp, spellnum)) {
			if (foundyou)
			    warning("spellcasting monster found you and doesn't know it?");
			return 0;
		    }
		    break;
		}
	    } while (--cnt > 0 &&
		    spell_would_be_useless(mtmp, mattk->adtyp, spellnum));
	    if (cnt == 0) return 0;
	}

	/* monster unable to cast spells? */
	if (mtmp->mcan || mtmp->mspec_used || !ml) {
	    cursetxt(mtmp, is_undirected_spell(mattk->adtyp, spellnum));
	    return 0;
	}

	if (mattk->adtyp == AD_SPEL || mattk->adtyp == AD_CLRC) {
	    mtmp->mspec_used = 10 - mtmp->m_lev;
	    if (mtmp->mspec_used < 2) mtmp->mspec_used = 2;
	    /* your quest leader is a badass and does not need recharge time */
	    if (mtmp->data->msound == MS_LEADER) mtmp->mspec_used = 0;
	}

	/* monster can cast spells, but is casting a directed spell at the
	   wrong place?  If so, give a message, and return.  Do this *after*
	   penalizing mspec_used. */
	if (!foundyou && thinks_it_foundyou &&
		!is_undirected_spell(mattk->adtyp, spellnum)) {
	    pline("%s casts a spell at %s!",
		canseemon(level, mtmp) ? Monnam(mtmp) : "Something",
		level->locations[mtmp->mux][mtmp->muy].typ == WATER
		    ? "empty water" : "thin air");
	    return 0;
	}

	nomul(0, NULL);
	if (rn2(ml*10) < (mtmp->mconf ? 100 : 20)) {	/* fumbled attack */
	    if (canseemon(level, mtmp) && flags.soundok)
		pline("The air crackles around %s.", mon_nam(mtmp));
	    return 0;
	}
	if (canspotmon(level, mtmp) || !is_undirected_spell(mattk->adtyp, spellnum)) {
	    pline("%s casts a spell%s!",
		  canspotmon(level, mtmp) ? Monnam(mtmp) : "Something",
		  is_undirected_spell(mattk->adtyp, spellnum) ? "" :
		  (Invisible && !perceives(mtmp->data) && 
		   (mtmp->mux != u.ux || mtmp->muy != u.uy)) ?
		  " at a spot near you" :
		  (Displaced && (mtmp->mux != u.ux || mtmp->muy != u.uy)) ?
		  " at your displaced image" :
		  " at you");
	}

/*
 *	As these are spells, the damage is related to the level
 *	of the monster casting the spell.
 */
	if (!foundyou) {
	    dmg = 0;
	    if (mattk->adtyp != AD_SPEL && mattk->adtyp != AD_CLRC) {
		warning(
	      "%s casting non-hand-to-hand version of hand-to-hand spell %d?",
			   Monnam(mtmp), mattk->adtyp);
		return 0;
	    }
	} else if (mattk->damd) {
	    dmg = dice(min(ml, 30) / 5 + mattk->damn, mattk->damd);
	} else {
	    dmg = dice(min(ml, 30) / 5 + 1, 6);
	}
	if (Half_spell_damage) dmg = (dmg+1) / 2;

	ret = 1;

	switch (mattk->adtyp) {

	    case AD_FIRE:
		pline("You're enveloped in flames!");
		fire_damageu(dmg, mtmp, NULL, 0, 0, TRUE, TRUE);
		dmg = 0;
		break;
	    case AD_COLD:
		pline("You're covered in frost!");
		cold_damageu(dmg, mtmp, NULL, 0, 0);
		dmg = 0;
		break;
	    case AD_MAGM:
		pline("You are hit by a shower of missiles!");
		mana_damageu(dmg, mtmp, NULL, 0, TRUE);
		dmg = 0;
		break;
	    case AD_SPEL:	/* wizard spell */
	    case AD_CLRC:       /* clerical spell */
	    {
		if (mattk->adtyp == AD_SPEL)
		    cast_wizard_spell(mtmp, dmg, spellnum);
		else
		    cast_cleric_spell(mtmp, dmg, spellnum);
		dmg = 0; /* done by the spell casting functions */
		break;
	    }
	}
	if (dmg) mdamageu(mtmp, dmg);
	return ret;
}